

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# esextcTessellationShaderInvariance.cpp
# Opt level: O1

string * __thiscall
glcts::TessellationShaderInvarianceBaseTest::getVSCode_abi_cxx11_
          (string *__return_storage_ptr__,TessellationShaderInvarianceBaseTest *this,
          uint n_iteration)

{
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)__return_storage_ptr__,
             "${VERSION}\n\nvoid main()\n{\n    gl_Position = vec4(1.0, 2.0, 3.0, 0.0);\n}\n","");
  return __return_storage_ptr__;
}

Assistant:

std::string TessellationShaderInvarianceBaseTest::getVSCode(unsigned int n_iteration)
{
	DE_UNREF(n_iteration);

	std::string result = "${VERSION}\n"
						 "\n"
						 "void main()\n"
						 "{\n"
						 "    gl_Position = vec4(1.0, 2.0, 3.0, 0.0);\n"
						 "}\n";

	return result;
}